

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_declassify(secp256k1_context *ctx,void *p,size_t len)

{
  size_t len_local;
  void *p_local;
  secp256k1_context *ctx_local;
  
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_declassify(const secp256k1_context* ctx, const void *p, size_t len) {
#if defined(VALGRIND)
    if (EXPECT(ctx->declassify,0)) VALGRIND_MAKE_MEM_DEFINED(p, len);
#else
    (void)ctx;
    (void)p;
    (void)len;
#endif
}